

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.cpp
# Opt level: O0

void __thiscall
Memory::RecyclerSweep::
MergePendingNewHeapBlockList<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this)

{
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *list_00;
  Data<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *pDVar1;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *list;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> **blockList;
  RecyclerSweep *this_local;
  
  pDVar1 = GetData<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>(this);
  list_00 = pDVar1->pendingMergeNewHeapBlockList;
  pDVar1->pendingMergeNewHeapBlockList =
       (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::RecyclerSweep::MergePendingNewHeapBlockList<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>()::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (list_00,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void
RecyclerSweep::MergePendingNewHeapBlockList()
{
    TBlockType *& blockList = this->GetData<TBlockType>().pendingMergeNewHeapBlockList;
    TBlockType * list = blockList;
    blockList = nullptr;
    HeapBlockList::ForEachEditing(list, [this](TBlockType * heapBlock)
    {
        auto& bucket = this->heapInfo->GetBucket<TBlockType::RequiredAttributes>(heapBlock->GetObjectSize());
        bucket.MergeNewHeapBlock(heapBlock);
    });
}